

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_deleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQObjectPtr *pSVar5;
  SQRESULT SVar6;
  SQObjectPtr res;
  SQObjectPtr *self;
  SQObjectPtr local_30;
  SQObjectPtr *local_20;
  
  if (v->_top - v->_stackbase < 2) {
    SQVM::Raise_Error(v,"not enough params in the stack");
    SVar6 = -1;
  }
  else {
    bVar4 = sq_aux_gettypedarg(v,idx,OT_TABLE,&local_20);
    SVar6 = -1;
    if (bVar4) {
      pSVar5 = SQVM::GetUp(v,-1);
      if ((pSVar5->super_SQObject)._type == OT_NULL) {
        sq_throwerror(v,"null is not a valid key");
      }
      else {
        local_30.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_30.super_SQObject._type = OT_NULL;
        bVar4 = SQVM::DeleteSlot(v,local_20,pSVar5,&local_30);
        if (bVar4) {
          if (pushval == 0) {
            SQVM::Pop(v);
          }
          else {
            pSVar5 = SQVM::GetUp(v,-1);
            SVar2 = (pSVar5->super_SQObject)._type;
            pSVar3 = (pSVar5->super_SQObject)._unVal.pTable;
            (pSVar5->super_SQObject)._unVal = local_30.super_SQObject._unVal;
            (pSVar5->super_SQObject)._type = local_30.super_SQObject._type;
            if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
              pSVar1 = &(((pSVar5->super_SQObject)._unVal.pTable)->super_SQDelegable).
                        super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            if ((SVar2 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[2])();
              }
            }
          }
          SVar6 = 0;
        }
        else {
          SVar6 = -1;
          SQVM::Pop(v);
        }
        SQObjectPtr::~SQObjectPtr(&local_30);
      }
    }
  }
  return SVar6;
}

Assistant:

SQRESULT sq_deleteslot(HSQUIRRELVM v,SQInteger idx,SQBool pushval)
{
    sq_aux_paramscheck(v, 2);
    SQObjectPtr *self;
    _GETSAFE_OBJ(v, idx, OT_TABLE,self);
    SQObjectPtr &key = v->GetUp(-1);
    if(sq_type(key) == OT_NULL) return sq_throwerror(v, _SC("null is not a valid key"));
    SQObjectPtr res;
    if(!v->DeleteSlot(*self, key, res)){
        v->Pop();
        return SQ_ERROR;
    }
    if(pushval) v->GetUp(-1) = res;
    else v->Pop();
    return SQ_OK;
}